

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O3

ostream * operator<<(ostream *os,SequenceDistanceGraphPath *sdgp)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"SequenceDistanceGraphPath (",0x1b);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(sdgp->sg->super_DistanceGraph).name._M_dataplus._M_p,
                      (sdgp->sg->super_DistanceGraph).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," nodes",6);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const SequenceDistanceGraphPath &sdgp) {
    os << "SequenceDistanceGraphPath (" << sdgp.sg.name << "): " << sdgp.nodes.size() << " nodes";
    return os;
}